

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O3

format_segment<char> *
fmt::impl::parse_format_segment<char>
          (format_segment<char> *__return_storage_ptr__,char *format,integer arg_index)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ushort uVar4;
  byte bVar5;
  uint uVar6;
  byte *pbVar7;
  fmtflags fVar8;
  long lVar9;
  streamsize sVar10;
  bool bVar11;
  bool bVar12;
  streamsize precision;
  integer index;
  byte *local_28;
  long local_20;
  long local_18;
  
  __return_storage_ptr__->valid = false;
  __return_storage_ptr__->base = 0;
  __return_storage_ptr__->nof_args = 0;
  __return_storage_ptr__->beginp = (char *)0x0;
  __return_storage_ptr__->endp = (char *)0x0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->endp + 6) = (undefined1  [16])0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->precision = 0;
  auVar2 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
  __return_storage_ptr__->value_index = -1;
  __return_storage_ptr__->width_index = auVar2._0_8_;
  __return_storage_ptr__->precision_index = auVar2._8_8_;
  __return_storage_ptr__->conversion = '\0';
  if (format == (char *)0x0) {
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->beginp = format;
  do {
    pbVar7 = (byte *)format;
    format = (char *)(pbVar7 + 1);
    bVar5 = *pbVar7;
    if (bVar5 == 0) break;
  } while (bVar5 != 0x25);
  __return_storage_ptr__->endp = (char *)pbVar7;
  if (bVar5 == 0) {
    __return_storage_ptr__->valid = true;
    return __return_storage_ptr__;
  }
  bVar5 = *format;
  if (bVar5 == 0) {
    return __return_storage_ptr__;
  }
  if (bVar5 != 0x25) {
    if ((byte)(bVar5 - 0x31) < 9) {
      pbVar7 = pbVar7 + 2;
      lVar9 = 0;
      do {
        if (0xccccccccccccccc < lVar9) goto LAB_00153857;
        if ((long)((ulong)(bVar5 & 0xf) ^ 0x7fffffffffffffff) < lVar9 * 10) goto LAB_00153857;
        lVar9 = lVar9 * 10 + (ulong)(bVar5 & 0xf);
        bVar5 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      } while (0xf5 < (byte)(bVar5 - 0x3a));
      if (bVar5 == 0x24) {
        __return_storage_ptr__->value_index = lVar9 + -1;
        format = (char *)pbVar7;
      }
LAB_00153857:
      bVar5 = *format;
    }
    fVar8 = ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
    uVar3 = 0;
    do {
      pbVar7 = (byte *)format + 1;
      switch(bVar5) {
      case 0x27:
        uVar3 = uVar3 | 0x2000;
        break;
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2c:
      case 0x2e:
      case 0x2f:
        goto switchD_00153880_caseD_28;
      case 0x2b:
        uVar3 = uVar3 | 0x40;
        fVar8 = fVar8 | _S_showpos;
        goto LAB_001538bd;
      case 0x2d:
        uVar3 = uVar3 | 0x800;
        fVar8 = fVar8 | _S_left;
LAB_001538bd:
        __return_storage_ptr__->flags = (flagset)uVar3;
        __return_storage_ptr__->fmtflags = fVar8;
        goto LAB_001538cd;
      case 0x30:
        uVar3 = uVar3 | 0x400;
        break;
      default:
        if (bVar5 != 0x20) {
          if (bVar5 == 0x23) {
            uVar3 = uVar3 | 0x1000;
            fVar8 = fVar8 | (_S_showpoint|_S_showbase);
            goto LAB_001538bd;
          }
          goto switchD_00153880_caseD_28;
        }
        uVar3 = uVar3 | 0x20;
      }
      __return_storage_ptr__->flags = (flagset)uVar3;
LAB_001538cd:
      bVar5 = *pbVar7;
      format = (char *)pbVar7;
    } while( true );
  }
  __return_storage_ptr__->valid = true;
  __return_storage_ptr__->endp = format;
  pbVar7 = pbVar7 + 2;
  goto LAB_00153c2f;
switchD_00153880_caseD_28:
  bVar11 = (~uVar3 & 0xc00) != 0;
  uVar6 = uVar3 & 0xfffffbff;
  if (bVar11) {
    uVar6 = uVar3;
  }
  bVar12 = (~uVar6 & 0x60) != 0;
  uVar3 = uVar6 & 0xffffffdf;
  if (bVar12) {
    uVar3 = uVar6;
  }
  if (!bVar12 || !bVar11) {
    __return_storage_ptr__->flags = (flagset)uVar3;
  }
  if (bVar5 == 0x2a) {
    uVar3 = uVar3 | 0x80;
    __return_storage_ptr__->flags = (flagset)uVar3;
    bVar5 = *pbVar7;
    lVar9 = arg_index;
    if ((byte)(bVar5 - 0x31) < 9) {
      pbVar7 = (byte *)format + 2;
      lVar9 = 0;
      do {
        if (0xccccccccccccccc < lVar9) {
          return __return_storage_ptr__;
        }
        if ((long)((ulong)(bVar5 & 0xf) ^ 0x7fffffffffffffff) < lVar9 * 10) {
          return __return_storage_ptr__;
        }
        lVar9 = lVar9 * 10 + (ulong)(bVar5 & 0xf);
        bVar5 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      } while (0xf5 < (byte)(bVar5 - 0x3a));
      if (bVar5 != 0x24) {
        return __return_storage_ptr__;
      }
      bVar5 = *pbVar7;
      lVar9 = lVar9 + -1;
    }
    __return_storage_ptr__->width_index = lVar9;
    __return_storage_ptr__->nof_args = 1;
    uVar4 = 1;
    format = (char *)pbVar7;
  }
  else {
    bVar5 = *format;
    if ((byte)(bVar5 - 0x3a) < 0xf6) {
      sVar10 = 0;
    }
    else {
      sVar10 = 0;
      do {
        format = (char *)pbVar7;
        if (0xccccccccccccccc < sVar10) {
          return __return_storage_ptr__;
        }
        if ((long)((ulong)(bVar5 & 0xf) ^ 0x7fffffffffffffff) < sVar10 * 10) {
          return __return_storage_ptr__;
        }
        sVar10 = sVar10 * 10 + (ulong)(bVar5 & 0xf);
        bVar5 = *format;
        pbVar7 = (byte *)format + 1;
      } while (0xf5 < (byte)(bVar5 - 0x3a));
    }
    __return_storage_ptr__->width = sVar10;
    uVar4 = 0;
  }
  pbVar7 = (byte *)format;
  if (bVar5 == 0x2e) {
    pbVar7 = (byte *)format + 1;
    __return_storage_ptr__->flags = (ushort)uVar3 | 0x100;
    bVar5 = ((byte *)format)[1];
    local_20 = 0;
    if (bVar5 == 0x2a) {
      __return_storage_ptr__->flags = (ushort)uVar3 | 0x300;
      pbVar7 = (byte *)format + 2;
      bVar5 = ((byte *)format)[2];
      if ((byte)(bVar5 - 0x31) < 9) {
        local_28 = pbVar7;
        bVar11 = parse_integer<char,long>((char **)&local_28,&local_18);
        if (!bVar11) {
          return __return_storage_ptr__;
        }
        if (*local_28 != 0x24) {
          return __return_storage_ptr__;
        }
        pbVar7 = local_28 + 1;
        bVar5 = local_28[1];
        __return_storage_ptr__->precision_index = local_18 + -1;
        uVar4 = __return_storage_ptr__->nof_args;
      }
      else {
        __return_storage_ptr__->precision_index = (ulong)uVar4 + arg_index;
      }
      __return_storage_ptr__->nof_args = uVar4 + 1;
    }
    else {
      if ((byte)(bVar5 - 0x30) < 10) {
        local_28 = pbVar7;
        bVar11 = parse_integer<char,long>((char **)&local_28,&local_20);
        if (!bVar11) {
          return __return_storage_ptr__;
        }
        bVar5 = *local_28;
        pbVar7 = local_28;
      }
      else {
        local_20 = 0;
      }
      __return_storage_ptr__->precision = local_20;
    }
    uVar3 = *(uint *)&__return_storage_ptr__->flags;
    if ((uVar3 >> 10 & 1) != 0) {
      uVar3 = uVar3 & 0xfbff;
      __return_storage_ptr__->flags = (flagset)uVar3;
    }
  }
  while( true ) {
    pbVar7 = pbVar7 + 1;
    uVar6 = bVar5 - 0x4c;
    if ((0x2e < uVar6) || ((0x410150000001U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) break;
    bVar5 = *pbVar7;
  }
  __return_storage_ptr__->conversion = bVar5;
  switch((uint)bVar5) {
  case 0x58:
    pbVar1 = (byte *)((long)&__return_storage_ptr__->fmtflags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  case 0x78:
    uVar3 = uVar3 | 4;
LAB_00153b72:
    __return_storage_ptr__->flags = (flagset)uVar3;
LAB_00153bc9:
    __return_storage_ptr__->base = 0x10;
    break;
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_00153b45_caseD_59;
  case 0x61:
    __return_storage_ptr__->fmtflags = __return_storage_ptr__->fmtflags | _S_floatfield;
    goto LAB_00153bc9;
  case 99:
switchD_00153b45_caseD_63:
    uVar3 = uVar3 | 2;
    goto LAB_00153ba5;
  case 100:
  case 0x69:
    goto switchD_00153b45_caseD_64;
  case 0x65:
    pbVar1 = (byte *)((long)&__return_storage_ptr__->fmtflags + 1);
    *pbVar1 = *pbVar1 | 1;
  case 0x67:
switchD_00153b45_caseD_67:
    __return_storage_ptr__->base = 10;
    break;
  case 0x66:
    *(undefined1 *)&__return_storage_ptr__->fmtflags =
         (char)__return_storage_ptr__->fmtflags | _S_fixed;
    goto switchD_00153b45_caseD_67;
  case 0x6e:
    break;
  case 0x6f:
    uVar3 = uVar3 | 4;
    __return_storage_ptr__->flags = (flagset)uVar3;
    __return_storage_ptr__->base = 8;
    break;
  case 0x70:
    __return_storage_ptr__->base = 0x10;
    uVar3 = uVar3 | 1;
LAB_00153ba5:
    __return_storage_ptr__->flags = (flagset)uVar3;
    break;
  case 0x73:
switchD_00153b45_caseD_73:
    *(undefined1 *)&__return_storage_ptr__->fmtflags =
         (char)__return_storage_ptr__->fmtflags | _S_boolalpha;
    break;
  case 0x75:
    uVar3 = uVar3 | 8;
switchD_00153b45_caseD_64:
    uVar3 = uVar3 | 4;
LAB_00153be9:
    __return_storage_ptr__->flags = (flagset)uVar3;
    goto switchD_00153b45_caseD_67;
  default:
    switch(bVar5) {
    case 0x41:
      __return_storage_ptr__->fmtflags =
           __return_storage_ptr__->fmtflags | (_S_uppercase|_S_floatfield);
      uVar3 = uVar3 | 0x10;
      goto LAB_00153b72;
    case 0x42:
    case 0x44:
      goto switchD_00153b45_caseD_59;
    case 0x43:
      goto switchD_00153b45_caseD_63;
    case 0x45:
      pbVar1 = (byte *)((long)&__return_storage_ptr__->fmtflags + 1);
      *pbVar1 = *pbVar1 | 0x41;
      break;
    case 0x46:
      __return_storage_ptr__->fmtflags = __return_storage_ptr__->fmtflags | (_S_uppercase|_S_fixed);
      break;
    case 0x47:
      pbVar1 = (byte *)((long)&__return_storage_ptr__->fmtflags + 1);
      *pbVar1 = *pbVar1 | 0x40;
      break;
    default:
      if (bVar5 != 0x53) {
        return __return_storage_ptr__;
      }
      goto switchD_00153b45_caseD_73;
    }
    uVar3 = uVar3 | 0x10;
    goto LAB_00153be9;
  }
  if (((uVar3 >> 0xd & 1) != 0) && (__return_storage_ptr__->base != 10)) {
    __return_storage_ptr__->flags = (ushort)uVar3 & 0xdfff;
  }
  __return_storage_ptr__->valid = true;
  if (__return_storage_ptr__->value_index < 0) {
    __return_storage_ptr__->value_index = arg_index + (ulong)__return_storage_ptr__->nof_args;
  }
  __return_storage_ptr__->nof_args = __return_storage_ptr__->nof_args + 1;
  if (*pbVar7 != 0) {
LAB_00153c2f:
    __return_storage_ptr__->nextp = (char *)pbVar7;
  }
switchD_00153b45_caseD_59:
  return __return_storage_ptr__;
}

Assistant:

inline format_segment<CharT>
parse_format_segment(const CharT* format, integer arg_index) {
   format_segment<CharT> result;
   if (!format) return result;

   /* skip everything until we encounter a placeholder
      or the end of the format string */
   result.beginp = format;
   CharT ch = *format;
   while (ch && ch != '%') {
      ch = *++format;
   }
   result.endp = format;

   /* end of format string reached? */
   if (!ch) {
      result.valid = true;
      return result;
   }

   ch = *++format;
   if (!ch) return result; /* format ends with '%' */

   /* process %% */
   if (ch == '%') {
      result.valid = true;
      ++result.endp; /* include first '%' */
      result.nextp = format+1;
      return result;
   }

   /* check if we have an argument index */
   if (ch >= '1' && ch <= '9') {
      const CharT* begin = format;
      integer index;
      if (parse_integer(format, index) && *format == '$') {
	 /* accept argument index */
	 result.value_index = index - 1;
	 ch = *++format;
      } else {
	 /* reset parsing */
	 format = begin; ch = *format;
      }
   }

   /* process conversion flags */
   while (ch == '\'' || ch == '-' || ch == '0' || ch == '+' ||
	 ch == ' ' || ch == '#') {
      switch (ch) {
	 case '\'':
	    result.flags |= grouping_flag;
	    break;
	 case '-':
	    result.flags |= minus_flag;
	    result.fmtflags |= std::ios_base::left;
	    break;
	 case '0': result.flags |= zero_fill; break;
	 case '+':
	    result.flags |= plus_flag;
	    result.fmtflags |= std::ios_base::showpos;
	    break;
	 case ' ': result.flags |= space_flag; break;
	 case '#':
	    result.flags |= special_flag;
	    result.fmtflags |= (std::ios_base::showbase |
	       std::ios_base::showpoint);
	    break;
      }
      ch = *++format;
   }

   if ((result.flags & minus_flag) && (result.flags & zero_fill)) {
      /* if the 0 and - flags both appear, the 0 flag is ignored */
      result.flags &= ~zero_fill;
   }
   if ((result.flags & plus_flag) && (result.flags & space_flag)) {
      /* if the ' ' and '+' flags both appear,
	 the <space> flag shall be ignored */
      result.flags &= ~space_flag;
   }
   /* minimum field width */
   std::streamsize width = 0;
   if (ch == '*') {
      result.flags |= dyn_width; ch = *++format;
      if (ch >= '1' && ch <= '9') {
	 integer index;
	 if (!parse_integer(format, index) || *format != '$') return result;
	 ch = *++format;
	 result.width_index = index - 1;
      } else {
	 result.width_index = arg_index + result.nof_args;
      }
      result.nof_args++;
   } else {
      if (!parse_integer(format, width)) return result;
      ch = *format;
      result.width = width;
   }
   /* precision */
   if (ch == '.') {
      result.flags |= precision;
      ch = *++format;
      std::streamsize precision = 0;
      if (ch == '*') {
	 result.flags |= dyn_precision; ch = *++format;
	 if (ch >= '1' && ch <= '9') {
	    integer index;
	    if (!parse_integer(format, index) || *format != '$') return result;
	    ch = *++format;
	    result.precision_index = index - 1;
	 } else {
	    result.precision_index = arg_index + result.nof_args;
	 }
	 result.nof_args++;
      } else {
	 if (ch >= '0' && ch <= '9') {
	    if (!parse_integer(format, precision)) return result;
	    ch = *format;
	 }
	 result.precision = precision;
      }
      if (result.flags & zero_fill) {
	 /* if a precision is specified, the 0 flag is ignored */
	 result.flags &= ~zero_fill;
      }
   }
   /* skip size specification */
   while (ch == 'l' || ch == 'L' || ch == 'h' ||
	 ch == 'j' || ch == 'z' || ch == 't') {
      ch = *++format;
   }
   /* conversion operation */
   result.conversion = ch;
   switch (ch) {
      case 'u':
	 result.flags |= is_unsigned;
	 FMT_PRINTF_FALLTHROUGH
      case 'd':
      case 'i':
	 result.flags |= is_integer;
	 result.base = 10;
	 break;
      case 'o':
	 result.flags |= is_integer;
	 result.base = 8;
	 break;
      case 'x':
	 result.flags |= is_integer;
	 result.base = 16;
	 break;
      case 'X':
	 result.fmtflags |= std::ios_base::uppercase;
	 result.flags |= is_integer;
	 result.base = 16;
	 break;
      case 'f':
	 result.fmtflags |= std::ios_base::fixed;
	 result.base = 10;
	 break;
      case 'F':
	 result.fmtflags |= (std::ios_base::fixed | std::ios_base::uppercase);
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'e':
	 result.fmtflags |= std::ios_base::scientific;
	 result.base = 10;
	 break;
      case 'E':
	 result.fmtflags |=
	    std::ios_base::scientific | std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'g':
	 /* default behaviour */
	 result.base = 10;
	 break;
      case 'G':
	 result.fmtflags |= std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'a':
	 result.fmtflags |= std::ios_base::scientific | std::ios_base::fixed;
	 result.base = 16;
	 break;
      case 'A':
	 result.fmtflags |= std::ios_base::scientific |
	    std::ios_base::fixed | std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 16;
	 break;
      case 'p':
	 result.base = 16;
	 result.flags |= is_pointer;
	 break;
      case 'C':
	 /* POSIX extension, equivalent to 'lc' */
      case 'c':
	 result.flags |= is_charval;
	 break;
      case 'S':
	 /* POSIX extension, equivalent to 'ls' */
      case 's':
	 /* when boolean values are printed with %s, we get
	    more readable results; idea taken from N3506 */
	 result.fmtflags |= std::ios_base::boolalpha;
	 break;
      case 'n':
	 /* nothing to be done here */
	 break;
      default:
	 return result;
   }
   if ((result.flags & grouping_flag) && (result.base != 10)) {
      /* grouping is just supported for %i, %d, %u, %f, %F,
         %g, and %G, i.e. all cases with base == 10 */
      result.flags &= ~grouping_flag;
   }
   result.valid = true;
   if (result.value_index < 0) {
      result.value_index = arg_index + result.nof_args;
   }
   result.nof_args++;
   ch = *++format;
   if (ch) {
      result.nextp = format;
   }
   return result;
}